

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O2

void crash_recovery_test(bool walflush)

{
  void *pvVar1;
  fdb_doc *pfVar2;
  void *pvVar3;
  fdb_doc *doc;
  fdb_status fVar4;
  int iVar5;
  size_t keylen;
  size_t metalen;
  size_t bodylen;
  char *pcVar6;
  char *__format;
  undefined7 in_register_00000039;
  ulong uVar7;
  fdb_seqnum_t fVar8;
  long lVar9;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  fdb_doc *rdoc;
  undefined4 local_4f4;
  fdb_kvs_config kvs_config;
  fdb_doc *apfStack_4d8 [10];
  timeval __test_begin;
  fdb_file_info file_info;
  fdb_config fconfig;
  char metabuf [256];
  char keybuf [256];
  char bodybuf [256];
  
  local_4f4 = (undefined4)CONCAT71(in_register_00000039,walflush);
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  mvcc_test* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fconfig.buffercache_size = 0;
  fconfig.seqtree_opt = '\x01';
  fconfig.wal_threshold = 0x400;
  fconfig.flags = 1;
  fconfig.compaction_threshold = '\0';
  fdb_open(&dbfile,"./mvcc_test2",&fconfig);
  fdb_kvs_open_default(dbfile,&db,&kvs_config);
  fVar4 = fdb_set_log_callback(db,logCallbackFunc,"crash_recovery_test");
  if (fVar4 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x106);
    crash_recovery_test(bool)::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x106,"void crash_recovery_test(bool)");
  }
  lVar9 = 0;
  for (uVar7 = 0; uVar7 != 10; uVar7 = uVar7 + 1) {
    sprintf(keybuf,"key%d",uVar7 & 0xffffffff);
    sprintf(metabuf,"meta%d",uVar7 & 0xffffffff);
    sprintf(bodybuf,"body%d",uVar7 & 0xffffffff);
    keylen = strlen(keybuf);
    metalen = strlen(metabuf);
    bodylen = strlen(bodybuf);
    fdb_doc_create((fdb_doc **)((long)apfStack_4d8 + lVar9),keybuf,keylen,metabuf,metalen,bodybuf,
                   bodylen);
    fdb_set(db,apfStack_4d8[uVar7]);
    lVar9 = lVar9 + 8;
  }
  if ((char)local_4f4 == '\0') {
    fVar4 = fdb_commit(dbfile,'\0');
    if (fVar4 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x118);
      crash_recovery_test(bool)::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x118,"void crash_recovery_test(bool)");
    }
  }
  else {
    fVar4 = fdb_commit(dbfile,'\x01');
    if (fVar4 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x115);
      crash_recovery_test(bool)::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x115,"void crash_recovery_test(bool)");
    }
  }
  fVar4 = fdb_get_file_info(dbfile,&file_info);
  if (fVar4 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x11c);
    crash_recovery_test(bool)::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x11c,"void crash_recovery_test(bool)");
  }
  uVar7 = (ulong)fconfig.blocksize;
  fdb_kvs_close(db);
  fdb_close(dbfile);
  fdb_shutdown();
  iVar5 = _disk_dump("./mvcc_test2",(file_info.file_size / uVar7) * (ulong)fconfig.blocksize,
                     (ulong)((fconfig.blocksize >> 2) + fconfig.blocksize * 2));
  if (iVar5 < 0) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x129);
    crash_recovery_test(bool)::__test_pass = 1;
    __assert_fail("r >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x129,"void crash_recovery_test(bool)");
  }
  fVar4 = fdb_open(&dbfile,"./mvcc_test2",&fconfig);
  if (fVar4 == FDB_RESULT_SUCCESS) {
    fVar4 = fdb_kvs_open_default(dbfile,&db,&kvs_config);
    if (fVar4 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x12f);
      crash_recovery_test(bool)::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x12f,"void crash_recovery_test(bool)");
    }
    fVar4 = fdb_set_log_callback(db,logCallbackFunc,"crash_recovery_test");
    if (fVar4 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x132);
      crash_recovery_test(bool)::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x132,"void crash_recovery_test(bool)");
    }
    lVar9 = 0;
    while( true ) {
      if (lVar9 == 10) {
        fVar8 = 1;
        while( true ) {
          if (fVar8 == 0xb) {
            for (lVar9 = 0; lVar9 != 10; lVar9 = lVar9 + 1) {
              fdb_doc_free(apfStack_4d8[lVar9]);
            }
            fdb_kvs_close(db);
            fdb_close(dbfile);
            fdb_shutdown();
            memleak_end();
            if ((char)local_4f4 == '\0') {
              if ((crash_recovery_test(bool)::__test_pass & 1) == 0) {
                __format = "%s PASSED\n";
              }
              else {
                __format = "%s FAILED\n";
              }
              pcVar6 = "crash recovery test - normal flush";
            }
            else {
              if ((crash_recovery_test(bool)::__test_pass & 1) == 0) {
                __format = "%s PASSED\n";
              }
              else {
                __format = "%s FAILED\n";
              }
              pcVar6 = "crash recovery test - walflush";
            }
            fprintf(_stderr,__format,pcVar6);
            return;
          }
          fdb_doc_create(&rdoc,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
          rdoc->seqnum = fVar8;
          fVar4 = fdb_get_byseq(db,rdoc);
          if (fVar4 != FDB_RESULT_SUCCESS) break;
          fdb_doc_free(rdoc);
          fVar8 = fVar8 + 1;
        }
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x149);
        crash_recovery_test(bool)::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x149,"void crash_recovery_test(bool)");
      }
      fdb_doc_create(&rdoc,apfStack_4d8[lVar9]->key,apfStack_4d8[lVar9]->keylen,(void *)0x0,0,
                     (void *)0x0,0);
      fVar4 = fdb_get(db,rdoc);
      doc = rdoc;
      if (fVar4 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x13a);
        crash_recovery_test(bool)::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x13a,"void crash_recovery_test(bool)");
      }
      pvVar1 = rdoc->meta;
      pfVar2 = apfStack_4d8[lVar9];
      pvVar3 = pfVar2->meta;
      iVar5 = bcmp(pvVar1,pvVar3,rdoc->metalen);
      if (iVar5 != 0) {
        fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar3,pvVar1,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x13b);
        crash_recovery_test(bool)::__test_pass = 1;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x13b,"void crash_recovery_test(bool)");
      }
      pvVar1 = doc->body;
      pvVar3 = pfVar2->body;
      iVar5 = bcmp(pvVar1,pvVar3,doc->bodylen);
      if (iVar5 != 0) break;
      fdb_doc_free(doc);
      lVar9 = lVar9 + 1;
    }
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar3,pvVar1,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x13c);
    crash_recovery_test(bool)::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x13c,"void crash_recovery_test(bool)");
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
          ,0x12d);
  crash_recovery_test(bool)::__test_pass = 1;
  __assert_fail("status == FDB_RESULT_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x12d,"void crash_recovery_test(bool)");
}

Assistant:

void crash_recovery_test(bool walflush)
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 10;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc;
    fdb_file_info file_info;
    uint64_t bid;
    const char *test_file = "./mvcc_test2";
    fdb_status status;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous mvcc_test files
    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.seqtree_opt = FDB_SEQTREE_USE; // enable seqtree since get_byseq
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;

    // reopen db
    fdb_open(&dbfile, test_file, &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "crash_recovery_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // insert documents
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }

    // commit
    if(walflush){
        status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    } else {
        status = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    status = fdb_get_file_info(dbfile, &file_info);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    bid = file_info.file_size / fconfig.blocksize;

    // close the db
    fdb_kvs_close(db);
    fdb_close(dbfile);

    // Shutdown forest db in the middle of the test to simulate crash
    fdb_shutdown();

    // append 9K of non-block aligned garbage at end of file
    r = _disk_dump(test_file, bid * fconfig.blocksize,
                   (2 * fconfig.blocksize) + (fconfig.blocksize / 4));
    TEST_CHK(r >= 0);

    // reopen the same file
    status = fdb_open(&dbfile, test_file, &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "crash_recovery_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // retrieve documents
    for (i=0;i<n;++i){
        // search by key
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);

        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
        TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);

        // free result document
        fdb_doc_free(rdoc);
    }

    // retrieve documents by sequence number
    for (i=0;i<n;++i){
        // search by seq
        fdb_doc_create(&rdoc, NULL, 0, NULL, 0, NULL, 0);
        rdoc->seqnum = i + 1;
        status = fdb_get_byseq(db, rdoc);

        TEST_CHK(status == FDB_RESULT_SUCCESS);

        // free result document
        fdb_doc_free(rdoc);
    }

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // close db file
    fdb_kvs_close(db);
    fdb_close(dbfile);

    // free all resources
    fdb_shutdown();

    memleak_end();

    if(walflush){
        TEST_RESULT("crash recovery test - walflush");
    } else {
        TEST_RESULT("crash recovery test - normal flush");
    }
}